

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_results.hpp
# Opt level: O0

basic_resolver_results<asio::ip::tcp> *
asio::ip::basic_resolver_results<asio::ip::tcp>::create
          (basic_resolver_results<asio::ip::tcp> *__return_storage_ptr__,addrinfo_type *address_info
          ,string *host_name,string *service_name)

{
  vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
  *this;
  data_type *__dest;
  element_type *this_00;
  __sv_type host;
  __sv_type service;
  basic_resolver_entry<asio::ip::tcp> local_d8;
  undefined1 local_78 [8];
  endpoint endpoint;
  undefined1 local_50 [8];
  string actual_host_name;
  string *service_name_local;
  string *host_name_local;
  addrinfo_type *address_info_local;
  basic_resolver_results<asio::ip::tcp> *results;
  
  actual_host_name.field_2._M_local_buf[0xf] = '\0';
  basic_resolver_results(__return_storage_ptr__);
  if (address_info == (addrinfo_type *)0x0) {
    actual_host_name.field_2._M_local_buf[0xf] = '\x01';
    actual_host_name.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_50,host_name);
    if (address_info->ai_canonname != (char *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 address_info->ai_canonname);
    }
    this = (vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
            *)operator_new(0x18);
    std::
    vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
    ::vector(this);
    std::
    __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    reset<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>>
              ((__shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
                *)__return_storage_ptr__,this);
    for (host_name_local = (string *)address_info; host_name_local != (string *)0x0;
        host_name_local = (string *)host_name_local[1]._M_string_length) {
      if ((*(int *)((long)&(host_name_local->_M_dataplus)._M_p + 4) == 2) ||
         (*(int *)((long)&(host_name_local->_M_dataplus)._M_p + 4) == 10)) {
        basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)local_78);
        basic_endpoint<asio::ip::tcp>::resize
                  ((basic_endpoint<asio::ip::tcp> *)local_78,
                   (ulong)*(uint *)&host_name_local->field_2);
        __dest = basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)local_78);
        memcpy(__dest,*(void **)((long)&host_name_local->field_2 + 8),
               (ulong)*(uint *)&host_name_local->field_2);
        this_00 = std::
                  __shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)__return_storage_ptr__);
        host = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
        service = std::__cxx11::string::operator_cast_to_basic_string_view((string *)service_name);
        basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
                  (&local_d8,(basic_endpoint<asio::ip::tcp> *)local_78,host,service);
        std::
        vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
        ::push_back(this_00,&local_d8);
        basic_resolver_entry<asio::ip::tcp>::~basic_resolver_entry(&local_d8);
      }
    }
    actual_host_name.field_2._M_local_buf[0xf] = '\x01';
    actual_host_name.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((actual_host_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    ~basic_resolver_results(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_resolver_results create(
      asio::detail::addrinfo_type* address_info,
      const std::string& host_name, const std::string& service_name)
  {
    basic_resolver_results results;
    if (!address_info)
      return results;

    std::string actual_host_name = host_name;
    if (address_info->ai_canonname)
      actual_host_name = address_info->ai_canonname;

    results.values_.reset(new values_type);

    while (address_info)
    {
      if (address_info->ai_family == ASIO_OS_DEF(AF_INET)
          || address_info->ai_family == ASIO_OS_DEF(AF_INET6))
      {
        using namespace std; // For memcpy.
        typename InternetProtocol::endpoint endpoint;
        endpoint.resize(static_cast<std::size_t>(address_info->ai_addrlen));
        memcpy(endpoint.data(), address_info->ai_addr,
            address_info->ai_addrlen);
        results.values_->push_back(
            basic_resolver_entry<InternetProtocol>(endpoint,
              actual_host_name, service_name));
      }
      address_info = address_info->ai_next;
    }

    return results;
  }